

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer_test.cc
# Opt level: O2

void __thiscall prometheus::anon_unknown_0::SerializerTest::SetUp(SerializerTest *this)

{
  Counter *this_00;
  Family<prometheus::Counter> family;
  allocator local_16a;
  allocator local_169;
  undefined1 local_168 [8];
  _Rb_tree_node_base _Stack_160;
  size_t local_140;
  string local_130;
  string local_110;
  Family<prometheus::Counter> local_f0;
  
  std::__cxx11::string::string((string *)&local_110,"requests_total",&local_169);
  std::__cxx11::string::string((string *)&local_130,"",&local_16a);
  local_168 = (undefined1  [8])0x0;
  _Stack_160._0_8_ = (pointer)0x0;
  _Stack_160._M_parent = (_Base_ptr)0x0;
  local_140 = 0;
  _Stack_160._M_left = &_Stack_160;
  _Stack_160._M_right = &_Stack_160;
  Family<prometheus::Counter>::Family(&local_f0,&local_110,&local_130,(Labels *)local_168);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_168);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  local_168 = (undefined1  [8])0x0;
  _Stack_160._0_8_ = (pointer)0x0;
  _Stack_160._M_parent = (_Base_ptr)0x0;
  local_140 = 0;
  _Stack_160._M_left = &_Stack_160;
  _Stack_160._M_right = &_Stack_160;
  this_00 = Family<prometheus::Counter>::Add<>(&local_f0,(Labels *)local_168);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_168);
  Counter::Increment(this_00);
  Family<prometheus::Counter>::Collect
            ((vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *)
             local_168,&local_f0);
  std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::_M_move_assign
            (&this->collected,
             (vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *)
             local_168);
  std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::~vector
            ((vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *)
             local_168);
  Family<prometheus::Counter>::~Family(&local_f0);
  return;
}

Assistant:

void SetUp() override {
    Family<Counter> family{"requests_total", "", {}};
    auto& counter = family.Add({});
    counter.Increment();

    collected = family.Collect();
  }